

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 SyStrToInt64(char *zSrc,sxu32 nLen,void *pOutVal,char **zRest)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  ushort **ppuVar4;
  char *pcVar6;
  short sVar7;
  long lVar8;
  char *pcVar9;
  ushort uVar10;
  ushort *puVar11;
  char *pcVar12;
  char *pcVar13;
  bool bVar14;
  ushort *puVar5;
  
  pcVar13 = zSrc + nLen;
  bVar14 = false;
  if (nLen != 0) {
    ppuVar4 = __ctype_b_loc();
    do {
      cVar1 = *zSrc;
      if ((*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
        if ((cVar1 == '+') || (cVar1 == '-')) {
          bVar14 = cVar1 == '-';
          goto LAB_0011bc28;
        }
        break;
      }
      zSrc = zSrc + 1;
    } while (zSrc < pcVar13);
  }
  for (; (zSrc < pcVar13 && (*zSrc == '0')); zSrc = zSrc + 1) {
LAB_0011bc28:
  }
  uVar3 = (int)pcVar13 - (int)zSrc;
  uVar10 = 0x13;
  if (0x12 < uVar3) {
    pcVar6 = "9223372036854775808";
    if (!bVar14) {
      pcVar6 = "9223372036854775807";
    }
    uVar3 = SyMemcmp(zSrc,pcVar6,0x13);
    uVar10 = (int)uVar3 < 1 | 0x12;
  }
  puVar5 = (ushort *)(ulong)uVar3;
  if (zSrc < pcVar13) {
    ppuVar4 = __ctype_b_loc();
    puVar5 = *ppuVar4;
    lVar8 = 0;
    puVar11 = (ushort *)0x0;
    pcVar9 = zSrc;
    do {
      if ((*(byte *)((long)puVar5 + (long)zSrc[lVar8] * 2 + 1) & 8) == 0) {
        pcVar6 = zSrc + lVar8;
        goto LAB_0011bd97;
      }
      puVar11 = (ushort *)(((long)zSrc[lVar8] + (long)puVar11 * 10) - 0x30);
      pcVar12 = zSrc + lVar8 + 1;
      pcVar6 = pcVar9 + 1;
      if (((pcVar13 <= pcVar12) || (sVar7 = (short)lVar8, (ushort)(uVar10 - 1) == sVar7)) ||
         (pcVar6 = pcVar12, (*(byte *)((long)puVar5 + (long)*pcVar12 * 2 + 1) & 8) == 0))
      goto LAB_0011bd97;
      puVar11 = (ushort *)(((long)*pcVar12 + (long)puVar11 * 10) - 0x30);
      pcVar6 = zSrc + lVar8 + 2;
      if ((pcVar13 <= pcVar6) || ((ushort)(uVar10 - 2) == sVar7)) goto LAB_0011bd97;
      if ((*(byte *)((long)puVar5 + (long)*pcVar6 * 2 + 1) & 8) == 0) {
        pcVar6 = pcVar9 + 2;
        goto LAB_0011bd97;
      }
      puVar11 = (ushort *)(((long)*pcVar6 + (long)puVar11 * 10) - 0x30);
      pcVar12 = zSrc + lVar8 + 3;
      pcVar6 = pcVar9 + 3;
      if (((pcVar13 <= pcVar12) || ((ushort)(uVar10 - 3) == sVar7)) ||
         (pcVar6 = pcVar12, (*(byte *)((long)puVar5 + (long)*pcVar12 * 2 + 1) & 8) == 0))
      goto LAB_0011bd97;
      puVar11 = (ushort *)(((long)*pcVar12 + (long)puVar11 * 10) - 0x30);
      lVar2 = lVar8 + 4;
      lVar8 = lVar8 + 4;
    } while ((zSrc + lVar2 < pcVar13) && (pcVar9 = pcVar9 + 4, (ushort)(uVar10 - 4) != sVar7));
    pcVar6 = zSrc + lVar8;
  }
  else {
    puVar11 = (ushort *)0x0;
    pcVar6 = zSrc;
  }
LAB_0011bd97:
  if (pcVar6 < pcVar13) {
    ppuVar4 = __ctype_b_loc();
    puVar5 = *ppuVar4;
    do {
      pcVar9 = pcVar6 + 1;
      if ((*(byte *)((long)puVar5 + (long)*pcVar6 * 2 + 1) & 0x20) == 0) break;
      pcVar6 = pcVar9;
    } while (pcVar9 < pcVar13);
  }
  if (pOutVal != (void *)0x0) {
    puVar5 = (ushort *)-(long)puVar11;
    if (puVar11 == (ushort *)0x0) {
      puVar5 = puVar11;
    }
    if (!bVar14) {
      puVar5 = puVar11;
    }
    *(ushort **)pOutVal = puVar5;
  }
  return (sxi32)puVar5;
}

Assistant:

JX9_PRIVATE sxi32 SyStrToInt64(const char *zSrc, sxu32 nLen, void * pOutVal, const char **zRest)
{
	int isNeg = FALSE;
	const char *zEnd;
	sxi64 nVal;
	sxi16 i;
#if defined(UNTRUST)
	if( SX_EMPTY_STR(zSrc) ){
		if( pOutVal ){
			*(sxi32 *)pOutVal = 0;
		}
		return SXERR_EMPTY;
	}
#endif
	zEnd = &zSrc[nLen];
	while(zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}
	if( zSrc < zEnd && ( zSrc[0] == '-' || zSrc[0] == '+' ) ){
		isNeg = (zSrc[0] == '-') ? TRUE :FALSE;
		zSrc++;
	}
	/* Skip leading zero */
	while(zSrc < zEnd && zSrc[0] == '0' ){
		zSrc++;
	}
	i = 19;
	if( (sxu32)(zEnd-zSrc) >= 19 ){
		i = SyMemcmp(zSrc, isNeg ? SXINT64_MIN_STR : SXINT64_MAX_STR, 19) <= 0 ? 19 : 18 ;
	}
	nVal = 0;
	for(;;){
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
	}
	/* Skip trailing spaces */
	while(zSrc < zEnd && SyisSpace(zSrc[0])){
		zSrc++;
	}
	if( zRest ){
		*zRest = (char *)zSrc;
	}	
	if( pOutVal ){
		if( isNeg == TRUE && nVal != 0 ){
			nVal = -nVal;
		}
		*(sxi64 *)pOutVal = nVal;
	}
	return (zSrc >= zEnd) ? SXRET_OK : SXERR_SYNTAX;
}